

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O0

int lws_pos_in_bounds(lws *wsi)

{
  lws *wsi_local;
  
  if ((wsi->http).ah == (allocated_headers *)0x0) {
    wsi_local._4_4_ = -1;
  }
  else if (((wsi->http).ah)->pos < ((wsi->a).context)->max_http_header_data) {
    wsi_local._4_4_ = 0;
  }
  else {
    if ((int)((wsi->http).ah)->pos < (int)(((wsi->a).context)->max_http_header_data - 1)) {
      _lws_log(1,"%s: pos %ld, limit %ld\n","lws_pos_in_bounds",(ulong)((wsi->http).ah)->pos,
               (ulong)((wsi->a).context)->max_http_header_data);
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/roles/http/parsers.c"
                    ,0x2af,"int lws_pos_in_bounds(struct lws *)");
    }
    _lws_log(1,"Ran out of header data space\n");
    wsi_local._4_4_ = 1;
  }
  return wsi_local._4_4_;
}

Assistant:

static int LWS_WARN_UNUSED_RESULT
lws_pos_in_bounds(struct lws *wsi)
{
	if (!wsi->http.ah)
		return -1;

	if (wsi->http.ah->pos <
	    (unsigned int)wsi->a.context->max_http_header_data)
		return 0;

	if ((int)wsi->http.ah->pos >= (int)wsi->a.context->max_http_header_data - 1) {
		lwsl_err("Ran out of header data space\n");
		return 1;
	}

	/*
	 * with these tests everywhere, it should never be able to exceed
	 * the limit, only meet it
	 */
	lwsl_err("%s: pos %ld, limit %ld\n", __func__,
		 (unsigned long)wsi->http.ah->pos,
		 (unsigned long)wsi->a.context->max_http_header_data);
	assert(0);

	return 1;
}